

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O0

bool __thiscall
CompareTxMemPoolEntryByDescendantScore::operator()
          (CompareTxMemPoolEntryByDescendantScore *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  long lVar1;
  strong_ordering sVar2;
  CompareTxMemPoolEntryByDescendantScore *in_RDX;
  duration<long,_std::ratio<1L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  double f2;
  double f1;
  double b_size;
  double b_mod_fee;
  double a_size;
  double a_mod_fee;
  __unspec *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  double *in_stack_ffffffffffffff98;
  CTxMemPoolEntry *in_stack_ffffffffffffffa0;
  undefined1 local_3a;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetModFeeAndSize(in_RDX,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (double *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  GetModFeeAndSize(in_RDX,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (double *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  dVar3 = local_10 * local_28;
  dVar4 = local_18 * local_20;
  if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
    local_3a = dVar3 < dVar4;
  }
  else {
    CTxMemPoolEntry::GetTime
              ((CTxMemPoolEntry *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    CTxMemPoolEntry::GetTime
              ((CTxMemPoolEntry *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                      ((duration<long,_std::ratio<1L,_1L>_> *)
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RDI);
    std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffff78,(__unspec *)0x783425);
    local_3a = std::operator>=(sVar2._M_value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_3a;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const CTxMemPoolEntry& a, const CTxMemPoolEntry& b) const
    {
        double a_mod_fee, a_size, b_mod_fee, b_size;

        GetModFeeAndSize(a, a_mod_fee, a_size);
        GetModFeeAndSize(b, b_mod_fee, b_size);

        // Avoid division by rewriting (a/b > c/d) as (a*d > c*b).
        double f1 = a_mod_fee * b_size;
        double f2 = a_size * b_mod_fee;

        if (f1 == f2) {
            return a.GetTime() >= b.GetTime();
        }
        return f1 < f2;
    }